

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugRenderViewportThumbnail
               (ImDrawList *draw_list,ImGuiViewportP_conflict1 *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  float fVar2;
  ImDrawList *pIVar3;
  ImGuiWindow *this;
  ImFont *font;
  char *text_begin;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiContext_conflict1 *pIVar15;
  ImGuiWindow_conflict *pIVar16;
  ImU32 IVar17;
  ulong uVar18;
  char *text_end;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ImVec4 local_a8;
  ImVec2 local_98;
  ImVec2 IStack_90;
  float local_88;
  float local_84;
  ImVec2 local_80;
  ImVec2 IStack_78;
  float local_70;
  float local_6c;
  undefined1 local_68 [16];
  ImVec2 *local_58;
  ImDrawList *local_50;
  ImRect *local_48;
  ImGuiViewportP_conflict *local_40;
  ImGuiWindow_conflict *local_38;
  
  pIVar15 = GImGui;
  local_38 = GImGui->CurrentWindow;
  local_84 = (bb->Min).x;
  local_88 = (bb->Min).y;
  local_6c = ((bb->Max).x - local_84) / (viewport->super_ImGuiViewport).Size.x;
  local_70 = ((bb->Max).y - local_88) / (viewport->super_ImGuiViewport).Size.y;
  fVar23 = (viewport->super_ImGuiViewport).Pos.x * local_6c;
  fVar2 = *(float *)(&DAT_00214b20 +
                    (ulong)(((uint)(viewport->super_ImGuiViewport).Flags >> 10 & 1) == 0) * 4);
  pIVar3 = local_38->DrawList;
  local_a8.x = (GImGui->Style).Colors[5].x;
  local_a8.y = (GImGui->Style).Colors[5].y;
  uVar4 = (GImGui->Style).Colors[5].z;
  uVar5 = (GImGui->Style).Colors[5].w;
  local_68._0_4_ = (viewport->super_ImGuiViewport).Pos.y * local_70;
  local_a8.w = fVar2 * 0.4 * (GImGui->Style).Alpha * (float)uVar5;
  local_a8.z = (float)uVar4;
  local_50 = draw_list;
  IVar17 = ColorConvertFloat4ToU32(&local_a8);
  local_58 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar3,&bb->Min,&bb->Max,IVar17,0.0,0);
  uVar20 = (pIVar15->Windows).Size;
  uVar18 = (ulong)uVar20;
  if (uVar20 != 0) {
    local_84 = local_84 - fVar23;
    local_88 = local_88 - (float)local_68._0_4_;
    uVar19 = 0;
    local_48 = bb;
    local_40 = (ImGuiViewportP_conflict *)viewport;
    do {
      if ((long)(int)uVar18 <= (long)uVar19) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      this = (ImGuiWindow *)(pIVar15->Windows).Data[uVar19];
      if (((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) &&
         (this->Viewport == (ImGuiViewportP_conflict *)viewport)) {
        fVar23 = (this->Pos).x;
        IStack_90.x = (this->Size).x + fVar23;
        IStack_90.y = (this->Size).y + (this->Pos).y;
        local_98.x = (this->Pos).x;
        local_98.y = (this->Pos).y;
        local_68 = ZEXT416((uint)(fVar23 + (this->SizeFull).x));
        ImGuiWindow::TitleBarHeight(this);
        pIVar16 = local_38;
        fVar21 = (float)(int)(local_98.x * local_6c + local_84);
        fVar24 = (float)(int)(local_98.y * local_70 + local_88);
        fVar25 = (float)(int)(IStack_90.x * local_6c + local_84);
        fVar30 = (float)(int)(IStack_90.y * local_70 + local_88);
        fVar22 = (float)(int)((this->Pos).x * local_6c + local_84);
        fVar26 = (float)(int)((this->Pos).y * local_70 + local_88);
        fVar31 = (float)(int)((float)local_68._0_4_ * local_6c + local_84);
        fVar27 = fVar26 + 5.0;
        fVar23 = (bb->Min).y;
        fVar28 = (bb->Max).x;
        fVar29 = (bb->Max).y;
        fVar32 = fVar23;
        if ((fVar23 <= fVar24) && (fVar32 = fVar29, fVar24 <= fVar29)) {
          fVar32 = fVar24;
        }
        fVar24 = (bb->Min).x;
        fVar33 = fVar28;
        if (fVar21 <= fVar28) {
          fVar33 = fVar21;
        }
        local_98.x = (float)(-(uint)(fVar21 < fVar24) & (uint)fVar24 |
                            ~-(uint)(fVar21 < fVar24) & (uint)fVar33);
        local_98.y = fVar32;
        fVar32 = fVar23;
        if ((fVar23 <= fVar30) && (fVar32 = fVar29, fVar30 <= fVar29)) {
          fVar32 = fVar30;
        }
        fVar21 = fVar28;
        if (fVar25 <= fVar28) {
          fVar21 = fVar25;
        }
        IStack_90.x = (float)(-(uint)(fVar25 < fVar24) & (uint)fVar24 |
                             ~-(uint)(fVar25 < fVar24) & (uint)fVar21);
        IStack_90.y = fVar32;
        fVar32 = fVar23;
        if ((fVar23 <= fVar26) && (fVar32 = fVar29, fVar26 <= fVar29)) {
          fVar32 = fVar26;
        }
        fVar21 = fVar28;
        if (fVar22 <= fVar28) {
          fVar21 = fVar22;
        }
        local_80.x = (float)(-(uint)(fVar22 < fVar24) & (uint)fVar24 |
                            ~-(uint)(fVar22 < fVar24) & (uint)fVar21);
        local_80.y = fVar32;
        if ((fVar23 <= fVar27) && (fVar23 = fVar29, fVar27 <= fVar29)) {
          fVar23 = fVar27;
        }
        if (fVar31 <= fVar28) {
          fVar28 = fVar31;
        }
        IStack_78.y = fVar23;
        IStack_78.x = (float)(-(uint)(fVar31 < fVar24) & (uint)fVar24 |
                             ~-(uint)(fVar31 < fVar24) & (uint)fVar28);
        if (pIVar15->NavWindow == (ImGuiWindow_conflict *)0x0) {
          uVar20 = 10;
        }
        else {
          uVar20 = this->RootWindowForTitleBarHighlight ==
                   (ImGuiWindow *)pIVar15->NavWindow->RootWindowForTitleBarHighlight | 10;
        }
        pIVar3 = local_38->DrawList;
        local_a8.x = (GImGui->Style).Colors[2].x;
        local_a8.y = (GImGui->Style).Colors[2].y;
        uVar6 = (GImGui->Style).Colors[2].z;
        uVar7 = (GImGui->Style).Colors[2].w;
        local_a8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar7;
        local_a8.z = (float)uVar6;
        IVar17 = ColorConvertFloat4ToU32(&local_a8);
        ImDrawList::AddRectFilled(pIVar3,&local_98,&IStack_90,IVar17,0.0,0);
        pIVar3 = pIVar16->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar20 << 4));
        local_a8._0_8_ = *puVar1;
        uVar8 = puVar1[1];
        local_a8.w = (float)((ulong)uVar8 >> 0x20);
        local_a8.z = (float)uVar8;
        local_a8.w = (GImGui->Style).Alpha * fVar2 * local_a8.w;
        IVar17 = ColorConvertFloat4ToU32(&local_a8);
        ImDrawList::AddRectFilled(pIVar3,&local_80,&IStack_78,IVar17,0.0,0);
        pIVar3 = pIVar16->DrawList;
        local_a8.x = (GImGui->Style).Colors[5].x;
        local_a8.y = (GImGui->Style).Colors[5].y;
        uVar9 = (GImGui->Style).Colors[5].z;
        uVar10 = (GImGui->Style).Colors[5].w;
        local_a8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar10;
        local_a8.z = (float)uVar9;
        IVar17 = ColorConvertFloat4ToU32(&local_a8);
        ImDrawList::AddRect(pIVar3,&local_98,&IStack_90,IVar17,0.0,0,1.0);
        pIVar3 = pIVar16->DrawList;
        font = pIVar15->Font;
        fVar23 = pIVar15->FontSize;
        local_a8.x = (GImGui->Style).Colors[0].x;
        local_a8.y = (GImGui->Style).Colors[0].y;
        uVar11 = (GImGui->Style).Colors[0].z;
        uVar12 = (GImGui->Style).Colors[0].w;
        local_a8.w = (GImGui->Style).Alpha * fVar2 * (float)uVar12;
        local_a8.z = (float)uVar11;
        IVar17 = ColorConvertFloat4ToU32(&local_a8);
        bb = local_48;
        text_begin = this->Name;
        text_end = text_begin;
        if (text_begin != (char *)0xffffffffffffffff) {
          do {
            if (*text_end == '#') {
              if (text_end[1] == '#') goto LAB_001a66b3;
            }
            else if (*text_end == '\0') goto LAB_001a66b3;
            text_end = text_end + 1;
          } while (text_end != (char *)0xffffffffffffffff);
          text_end = (char *)0xffffffffffffffff;
        }
LAB_001a66b3:
        ImDrawList::AddText(pIVar3,font,fVar23,&local_80,IVar17,text_begin,text_end,0.0,
                            (ImVec4 *)0x0);
        viewport = (ImGuiViewportP_conflict1 *)local_40;
      }
      uVar19 = uVar19 + 1;
      uVar18 = (ulong)(uint)(pIVar15->Windows).Size;
    } while (uVar19 != uVar18);
  }
  local_a8.x = (GImGui->Style).Colors[5].x;
  local_a8.y = (GImGui->Style).Colors[5].y;
  uVar13 = (GImGui->Style).Colors[5].z;
  uVar14 = (GImGui->Style).Colors[5].w;
  local_a8.w = fVar2 * (GImGui->Style).Alpha * (float)uVar14;
  local_a8.z = (float)uVar13;
  IVar17 = ColorConvertFloat4ToU32(&local_a8);
  ImDrawList::AddRect(local_50,&bb->Min,local_58,IVar17,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = (viewport->Flags & ImGuiViewportFlags_Minimized) ? 0.30f : 1.00f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;
        if (thumb_window->Viewport != viewport)
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}